

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O1

void __thiscall InputGraph::set_vertex_name(InputGraph *this,int v,string_view l)

{
  _Head_base<0UL,_InputGraph::Imp_*,_false> _Var1;
  char *explanation;
  string_view name;
  long *local_78;
  long local_70;
  long local_68 [2];
  int local_58 [2];
  long *local_50 [2];
  long local_40 [2];
  
  explanation = l._M_str;
  name._M_str = "vertex name";
  name._M_len = (size_t)explanation;
  anon_unknown.dwarf_2d2cc1::sanity_check_name
            ((anon_unknown_dwarf_2d2cc1 *)l._M_len,name,explanation);
  boost::multi_index::detail::hashed_index<$41bb0298$>::erase
            ((hashed_index<_41bb0298_> *)
             ((left_map *)
             ((long)&((this->_imp)._M_t.
                      super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>
                      .super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl)->vertex_names +
             0x98))->super_unordered_map_adaptor<_d10c590c_>,v);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
       super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
       super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,explanation,
             (anon_unknown_dwarf_2d2cc1 *)l._M_len + (long)explanation);
  local_58[0] = v;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_78,local_70 + (long)local_78);
  boost::multi_index::
  multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>::core_indices,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>
  ::insert_<boost::multi_index::detail::lvalue_tag>
            ((multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,_boost::hash<int>,_std::equal_to<int>_>,_boost::bimaps::unordered_set_of<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_boost::container::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_2U,_0U>,_mpl_::na,_mpl_::na>::core_indices,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>
              *)((long)(*(hashed_index<_41bb0298_> **)
                         ((long)&(_Var1._M_head_impl)->vertex_names + 8) + 0xffffffffffffffff) +
                0x28),local_58);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

auto InputGraph::set_vertex_name(int v, string_view l) -> void
{
    sanity_check_name(l, "vertex name");
    _imp->vertex_names.left.erase(v);
    _imp->vertex_names.insert(Names::value_type{v, string{l}});
}